

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::RecordLegacyLocation
          (LocationRecorder *this,Message *descriptor,ErrorLocation location)

{
  SourceLocationTable *this_00;
  int32 line;
  int32 column;
  
  this_00 = this->parser_->source_location_table_;
  if (this_00 != (SourceLocationTable *)0x0) {
    line = SourceCodeInfo_Location::span(this->location_,0);
    column = SourceCodeInfo_Location::span(this->location_,1);
    SourceLocationTable::Add(this_00,descriptor,location,line,column);
    return;
  }
  return;
}

Assistant:

void Parser::LocationRecorder::RecordLegacyLocation(const Message* descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location) {
  if (parser_->source_location_table_ != NULL) {
    parser_->source_location_table_->Add(
        descriptor, location, location_->span(0), location_->span(1));
  }
}